

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

int inproc_ep_get_addr(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  undefined1 local_b8 [8];
  nng_sockaddr sa;
  inproc_ep *ep;
  size_t *psStack_20;
  nni_opt_type t_local;
  size_t *szp_local;
  void *v_local;
  void *arg_local;
  
  local_b8._0_2_ = 1;
  sa.s_storage.sa_pad[0xf] = (uint64_t)arg;
  ep._4_4_ = t;
  psStack_20 = szp;
  szp_local = (size_t *)v;
  v_local = arg;
  nni_strlcpy(local_b8 + 2,*arg,0x80);
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_b8,szp_local,psStack_20,ep._4_4_);
  return iVar1;
}

Assistant:

static int
inproc_ep_get_addr(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	inproc_ep   *ep = arg;
	nng_sockaddr sa;
	sa.s_inproc.sa_family = NNG_AF_INPROC;
	nni_strlcpy(
	    sa.s_inproc.sa_name, ep->addr, sizeof(sa.s_inproc.sa_name));
	return (nni_copyout_sockaddr(&sa, v, szp, t));
}